

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

bool decode_block_mode_2d
               (uint block_mode,uint *x_weights,uint *y_weights,bool *is_dual_plane,uint *quant_mode
               ,uint *weight_bits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RCX;
  int *in_RDX;
  int *in_RSI;
  uint in_EDI;
  int *in_R8;
  uint *in_R9;
  uint weight_count;
  uint B_1;
  uint B;
  uint A;
  uint D;
  uint H;
  uint base_quant_mode;
  bool local_65;
  ulong in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_38 = in_EDI >> 9 & 1;
  local_3c = in_EDI >> 10 & 1;
  uVar3 = in_EDI >> 5 & 3;
  *in_RSI = 0;
  *in_RDX = 0;
  if ((in_EDI & 3) == 0) {
    local_34 = (in_EDI >> 2 & 3) << 1;
    if ((in_EDI >> 2 & 3) == 0) {
      return false;
    }
    switch(in_EDI >> 7 & 3) {
    case 0:
      *in_RSI = 0xc;
      *in_RDX = uVar3 + 2;
      break;
    case 1:
      *in_RSI = uVar3 + 2;
      *in_RDX = 0xc;
      break;
    case 2:
      *in_RSI = uVar3 + 6;
      *in_RDX = (in_EDI >> 9 & 3) + 6;
      local_3c = 0;
      local_38 = 0;
      break;
    case 3:
      uVar3 = in_EDI >> 5 & 3;
      if (uVar3 == 0) {
        *in_RSI = 6;
        *in_RDX = 10;
      }
      else if (uVar3 == 1) {
        *in_RSI = 10;
        *in_RDX = 6;
      }
      else if (uVar3 - 2 < 2) {
        return false;
      }
    }
  }
  else {
    local_34 = (in_EDI & 3) * 2;
    uVar4 = in_EDI >> 7 & 3;
    in_stack_ffffffffffffffa8 = (ulong)(in_EDI >> 2 & 3);
    switch(in_stack_ffffffffffffffa8) {
    case 0:
      *in_RSI = uVar4 + 4;
      *in_RDX = uVar3 + 2;
      break;
    case 1:
      *in_RSI = uVar4 + 8;
      *in_RDX = uVar3 + 2;
      break;
    case 2:
      *in_RSI = uVar3 + 2;
      *in_RDX = uVar4 + 8;
      break;
    case 3:
      uVar4 = in_EDI >> 7 & 1;
      if ((in_EDI & 0x100) == 0) {
        *in_RSI = uVar3 + 2;
        *in_RDX = uVar4 + 6;
      }
      else {
        *in_RSI = uVar4 + 2;
        *in_RDX = uVar3 + 2;
      }
    }
  }
  local_34 = in_EDI >> 4 & 1 | local_34;
  iVar1 = *in_RSI;
  iVar2 = *in_RDX;
  *in_R8 = (local_34 - 2) + local_38 * 6;
  *(bool *)in_RCX = local_3c != 0;
  uVar3 = get_ise_sequence_bitcount
                    (in_stack_ffffffffffffffb0,(quant_method)(in_stack_ffffffffffffffa8 >> 0x20));
  *in_R9 = uVar3;
  local_65 = false;
  if ((iVar1 * iVar2 * (local_3c + 1) < 0x41) && (local_65 = false, 0x17 < *in_R9)) {
    local_65 = *in_R9 < 0x61;
  }
  return local_65;
}

Assistant:

static bool decode_block_mode_2d(
	unsigned int block_mode,
	unsigned int& x_weights,
	unsigned int& y_weights,
	bool& is_dual_plane,
	unsigned int& quant_mode,
	unsigned int& weight_bits
) {
	unsigned int base_quant_mode = (block_mode >> 4) & 1;
	unsigned int H = (block_mode >> 9) & 1;
	unsigned int D = (block_mode >> 10) & 1;
	unsigned int A = (block_mode >> 5) & 0x3;

	x_weights = 0;
	y_weights = 0;

	if ((block_mode & 3) != 0)
	{
		base_quant_mode |= (block_mode & 3) << 1;
		unsigned int B = (block_mode >> 7) & 3;
		switch ((block_mode >> 2) & 3)
		{
		case 0:
			x_weights = B + 4;
			y_weights = A + 2;
			break;
		case 1:
			x_weights = B + 8;
			y_weights = A + 2;
			break;
		case 2:
			x_weights = A + 2;
			y_weights = B + 8;
			break;
		case 3:
			B &= 1;
			if (block_mode & 0x100)
			{
				x_weights = B + 2;
				y_weights = A + 2;
			}
			else
			{
				x_weights = A + 2;
				y_weights = B + 6;
			}
			break;
		}
	}
	else
	{
		base_quant_mode |= ((block_mode >> 2) & 3) << 1;
		if (((block_mode >> 2) & 3) == 0)
		{
			return false;
		}

		unsigned int B = (block_mode >> 9) & 3;
		switch ((block_mode >> 7) & 3)
		{
		case 0:
			x_weights = 12;
			y_weights = A + 2;
			break;
		case 1:
			x_weights = A + 2;
			y_weights = 12;
			break;
		case 2:
			x_weights = A + 6;
			y_weights = B + 6;
			D = 0;
			H = 0;
			break;
		case 3:
			switch ((block_mode >> 5) & 3)
			{
			case 0:
				x_weights = 6;
				y_weights = 10;
				break;
			case 1:
				x_weights = 10;
				y_weights = 6;
				break;
			case 2:
			case 3:
				return false;
			}
			break;
		}
	}

	unsigned int weight_count = x_weights * y_weights * (D + 1);
	quant_mode = (base_quant_mode - 2) + 6 * H;
	is_dual_plane = D != 0;

	weight_bits = get_ise_sequence_bitcount(weight_count, static_cast<quant_method>(quant_mode));
	return (weight_count <= BLOCK_MAX_WEIGHTS &&
	        weight_bits >= BLOCK_MIN_WEIGHT_BITS &&
	        weight_bits <= BLOCK_MAX_WEIGHT_BITS);
}